

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O3

double __thiscall
FIX::double_conversion::StringToDoubleConverter::StringToIeee<char_const*>
          (StringToDoubleConverter *this,char *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  double_conversion dVar1;
  uint uVar2;
  bool bVar3;
  StringToDoubleConverter *pSVar4;
  ulong uVar5;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  char cVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  char *pcVar15;
  int iVar16;
  long lVar17;
  char cVar18;
  int iVar19;
  StringToDoubleConverter *pSVar20;
  StringToDoubleConverter *end;
  StringToDoubleConverter *pSVar21;
  byte bVar22;
  char cVar23;
  int iVar24;
  bool sign;
  float fVar25;
  double dVar26;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  bool result_is_junk_1;
  char *start;
  char buffer [782];
  StringToDoubleConverter *local_370;
  uint local_364;
  int *local_360;
  undefined4 local_358;
  bool local_351;
  double_conversion *local_350;
  double_conversion local_348 [792];
  undefined7 uVar6;
  
  *processed_characters_count = 0;
  if (length == 0) {
LAB_0016f9f2:
    return this->empty_string_value_;
  }
  uVar5 = (ulong)(uint)length;
  end = (StringToDoubleConverter *)(input + length);
  uVar2 = this->flags_;
  bVar22 = (byte)uVar2;
  local_370 = (StringToDoubleConverter *)input;
  if ((uVar2 & 0x18) != 0) {
    do {
      cVar23 = (char)local_370->flags_;
      lVar9 = 0;
      while ((&kWhitespaceTable7)[lVar9] != cVar23) {
        lVar9 = lVar9 + 1;
        if (lVar9 == 6) {
          pSVar4 = (StringToDoubleConverter *)0x0;
          if (local_370 != (StringToDoubleConverter *)input && (char)((uVar2 & 8) >> 3) == '\0')
          goto LAB_001701cc;
          goto LAB_0016fa22;
        }
      }
      local_370 = (StringToDoubleConverter *)((long)&local_370->flags_ + 1);
    } while (local_370 != end);
    *processed_characters_count = length;
    goto LAB_0016f9f2;
  }
  cVar23 = *input;
  pSVar4 = this;
LAB_0016fa22:
  if ((cVar23 == '-') || (cVar23 == '+')) {
    sign = cVar23 == '-';
    if ((StringToDoubleConverter *)((long)&local_370->flags_ + 1) != end) {
      lVar9 = 1;
      do {
        lVar17 = 0;
        while ((&kWhitespaceTable7)[lVar17] != *(char *)((long)&local_370->flags_ + lVar9)) {
          lVar17 = lVar17 + 1;
          if (lVar17 == 6) {
            if (lVar9 != 1 && (char)((uVar2 & 0x20) >> 5) == '\0') goto LAB_001701cc;
            pSVar4 = (StringToDoubleConverter *)((long)&local_370->flags_ + lVar9);
            cVar23 = *(char *)((long)&local_370->flags_ + lVar9);
            local_370 = pSVar4;
            goto LAB_0016fac0;
          }
        }
        lVar17 = lVar9 + 1;
        lVar9 = lVar9 + 1;
      } while ((StringToDoubleConverter *)((long)&local_370->flags_ + lVar17) != end);
    }
    goto LAB_001701cc;
  }
  sign = false;
LAB_0016fac0:
  pcVar15 = this->infinity_symbol_;
  cVar11 = (char)((uVar2 & 0x10) >> 4);
  iVar24 = (int)input;
  if ((pcVar15 != (char *)0x0) && (cVar23 == *pcVar15)) {
    bVar3 = ConsumeSubString<char_const*>((char **)&local_370,(char *)end,pcVar15);
    if ((bVar3) &&
       (cVar23 = (char)((uVar2 & 4) >> 2), local_370 == end || (cVar11 != '\0' || cVar23 != '\0')))
    {
      pSVar4 = local_370;
      if (cVar23 == '\0' && local_370 != end) {
        do {
          lVar9 = 0;
          while ((&kWhitespaceTable7)[lVar9] != (char)pSVar4->flags_) {
            lVar9 = lVar9 + 1;
            if (lVar9 == 6) goto LAB_001701cc;
          }
          pSVar4 = (StringToDoubleConverter *)((long)&pSVar4->flags_ + 1);
          local_370 = end;
        } while (pSVar4 != end);
      }
      *processed_characters_count = (int)local_370 - iVar24;
      if (sign != false) {
        return -INFINITY;
      }
      return INFINITY;
    }
    goto LAB_001701cc;
  }
  pcVar15 = this->nan_symbol_;
  if ((pcVar15 != (char *)0x0) && (cVar23 == *pcVar15)) {
    bVar3 = ConsumeSubString<char_const*>((char **)&local_370,(char *)end,pcVar15);
    if ((bVar3) &&
       (cVar23 = (char)((uVar2 & 4) >> 2), local_370 == end || (cVar11 != '\0' || cVar23 != '\0')))
    {
      pSVar4 = local_370;
      if (cVar23 == '\0' && local_370 != end) {
        do {
          lVar9 = 0;
          while ((&kWhitespaceTable7)[lVar9] != (char)pSVar4->flags_) {
            lVar9 = lVar9 + 1;
            if (lVar9 == 6) goto LAB_001701cc;
          }
          pSVar4 = (StringToDoubleConverter *)((long)&pSVar4->flags_ + 1);
          local_370 = end;
        } while (pSVar4 != end);
      }
      *processed_characters_count = (int)local_370 - iVar24;
      if (sign != false) {
        return -NAN;
      }
      return NAN;
    }
    goto LAB_001701cc;
  }
  iVar19 = 0;
  if (cVar23 == '0') {
    pSVar20 = (StringToDoubleConverter *)((long)&local_370->flags_ + 1);
    if (pSVar20 != end) {
      if (((uVar2 & 1) != 0) && ((byte)((byte)pSVar20->flags_ | 0x20) == 0x78)) {
        local_370 = (StringToDoubleConverter *)((long)&local_370->flags_ + 2);
        if ((local_370 != end) &&
           ((bVar22 = (byte)local_370->flags_, (char)bVar22 < 0x40 && (int)(char)bVar22 - 0x30U < 10
            || ((bVar22 - 0x41 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)(bVar22 - 0x41) & 0x3f) & 1) != 0)))))) {
          dVar26 = RadixStringToIeee<4,char_const*>
                             ((char **)&local_370,(char *)end,sign,SUB41((uVar2 & 4) >> 2,0),
                              this->junk_string_value_,read_as_double,(bool *)local_348);
          if (local_348[0] != (double_conversion)0x0) {
            return dVar26;
          }
          pSVar4 = local_370;
          if (local_370 != end && (uVar2 & 0x10) != 0) {
            do {
              lVar9 = 0;
              while ((&kWhitespaceTable7)[lVar9] != (char)local_370->flags_) {
                lVar9 = lVar9 + 1;
                pSVar4 = local_370;
                if (lVar9 == 6) goto LAB_0016fd63;
              }
              local_370 = (StringToDoubleConverter *)((long)&local_370->flags_ + 1);
              pSVar4 = end;
            } while (local_370 != end);
          }
LAB_0016fd63:
          *processed_characters_count = (int)pSVar4 - iVar24;
          return dVar26;
        }
        goto LAB_001701cc;
      }
      do {
        if ((char)pSVar20->flags_ != '0') {
          uVar13 = (uint)(bVar22 >> 1);
          local_370 = pSVar20;
          goto LAB_0016fbc2;
        }
        pSVar20 = (StringToDoubleConverter *)((long)&pSVar20->flags_ + 1);
      } while (pSVar20 != end);
    }
LAB_0016fd80:
    *processed_characters_count = length;
    if (sign == false) {
      return 0.0;
    }
    return -0.0;
  }
  uVar13 = 0;
LAB_0016fbc2:
  uVar10 = 0;
  pcVar15 = (char *)0x0;
  uVar8 = 0;
  pSVar20 = local_370;
  do {
    dVar1 = *(double_conversion *)&pSVar20->flags_;
    uVar6 = (undefined7)((ulong)pSVar4 >> 8);
    pSVar4 = (StringToDoubleConverter *)CONCAT71(uVar6,dVar1);
    uVar7 = uVar8;
    local_360 = processed_characters_count;
    if (9 < (byte)((char)dVar1 - 0x30U)) {
      local_358 = (undefined4)uVar8;
      local_364 = uVar13;
      if (iVar19 == 0) {
        local_364 = 0;
      }
      iVar16 = 0;
      pSVar4 = pSVar20;
      uVar12 = local_364;
      if (dVar1 != (double_conversion)0x2e) goto LAB_0016fe56;
      if (((~(byte)local_364 | bVar22 >> 2) & 1) == 0) goto LAB_001701cc;
      iVar16 = 0;
      pSVar21 = pSVar20;
      local_370 = pSVar20;
      if ((local_364 & 1) == 0) {
        pSVar4 = (StringToDoubleConverter *)((long)&pSVar20->flags_ + 1);
        local_370 = pSVar4;
        if (pSVar4 != end) {
          iVar16 = 0;
          if ((iVar19 != 0) || (iVar16 = 0, (char)pSVar4->flags_ != '0')) goto LAB_0017009c;
          iVar16 = 0;
          pSVar20 = (StringToDoubleConverter *)((long)&pSVar20->flags_ + 2);
          goto LAB_00170078;
        }
        pSVar21 = end;
        uVar12 = uVar13;
        if (iVar19 == 0) {
          if (cVar23 != '0') goto LAB_001701cc;
          goto LAB_0016fe04;
        }
      }
      break;
    }
    if (iVar19 < 0x304) {
      iVar16 = (int)pcVar15;
      if (0x30d < iVar16) {
        __assert_fail("buffer_pos < kBufferSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x319,
                      "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                     );
      }
      pcVar15 = (char *)(ulong)(iVar16 + 1);
      local_348[iVar16] = dVar1;
      iVar19 = iVar19 + 1;
    }
    else {
      uVar10 = (ulong)((int)uVar10 + 1);
      pSVar4 = (StringToDoubleConverter *)
               CONCAT71(uVar6,dVar1 != (double_conversion)0x30 | (byte)uVar8);
      uVar7 = (ulong)pSVar4 & 0xffffff01;
    }
    iVar16 = 0;
    uVar12 = 0;
    if ((uVar13 & 1) != 0) {
      uVar12 = (uint)((char)pSVar20->flags_ < '8');
    }
    pSVar20 = (StringToDoubleConverter *)((long)&pSVar20->flags_ + 1);
    uVar8 = uVar7;
    pSVar21 = end;
    uVar13 = uVar12;
  } while (pSVar20 != end);
  goto LAB_0016fc3e;
LAB_0016fe56:
  if ((iVar19 == 0 && iVar16 == 0) && cVar23 != '0') goto LAB_001701cc;
  local_370 = pSVar4;
  if ((byte)((byte)pSVar4->flags_ | 0x20) == 0x65) {
    if (((~(byte)local_364 | bVar22 >> 2) & 1) == 0) goto LAB_001701cc;
    pSVar21 = pSVar4;
    if ((local_364 & 1) == 0) {
      local_370 = (StringToDoubleConverter *)((long)&pSVar4->flags_ + 1);
      pSVar21 = end;
      if ((local_370 != end) &&
         (((cVar23 = (char)local_370->flags_, cVar23 != '-' && (cVar18 = '+', cVar23 != '+')) ||
          (local_370 = (StringToDoubleConverter *)((long)&pSVar4->flags_ + 2), cVar18 = cVar23,
          local_370 != end)))) {
        local_358 = CONCAT31((int3)(uVar8 >> 8),cVar18);
        pSVar21 = local_370;
        if ((local_370 != end) && (bVar22 = (byte)local_370->flags_, 0xf5 < (byte)(bVar22 - 0x3a)))
        {
          if (0x3ffffffe < iVar16 + 0x1fffffffU) {
            __assert_fail("-max_exponent / 2 <= exponent && exponent <= max_exponent / 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                          ,0x380,
                          "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                         );
          }
          iVar19 = 0;
          do {
            local_370 = (StringToDoubleConverter *)((long)&local_370->flags_ + 1);
            if (iVar19 < 0x6666666) {
LAB_00170168:
              local_360 = (int *)CONCAT44(local_360._4_4_,(uint)bVar22 + iVar19 * 10 + -0x30);
            }
            else {
              local_360 = (int *)CONCAT44(local_360._4_4_,0x3fffffff);
              if ((iVar19 == 0x6666666) && (bVar22 < 0x34)) goto LAB_00170168;
            }
          } while ((local_370 != end) &&
                  (bVar22 = (byte)local_370->flags_, iVar19 = (int)local_360,
                  (byte)(bVar22 - 0x30) < 10));
          iVar19 = -(int)local_360;
          if (cVar18 != '-') {
            iVar19 = (int)local_360;
          }
          iVar16 = iVar19 + iVar16;
          goto LAB_001701b5;
        }
      }
      if ((uVar2 & 4) == 0) goto LAB_001701cc;
    }
  }
  else {
LAB_001701b5:
    if ((cVar11 == '\0' && (char)((uVar2 & 4) >> 2) == '\0') && (local_370 != end)) {
LAB_001701cc:
      return this->junk_string_value_;
    }
    if ((uVar2 & 4) == 0) {
      for (; local_370 != end; local_370 = (StringToDoubleConverter *)((long)&local_370->flags_ + 1)
          ) {
        lVar9 = 0;
        while ((&kWhitespaceTable7)[lVar9] != (char)local_370->flags_) {
          lVar9 = lVar9 + 1;
          if (lVar9 == 6) goto LAB_001701cc;
        }
      }
    }
    pSVar21 = local_370;
    pSVar4 = local_370;
    if ((uVar2 & 0x10) != 0) {
      for (; pSVar4 != end; pSVar4 = (StringToDoubleConverter *)((long)&pSVar4->flags_ + 1)) {
        lVar9 = 0;
        while ((&kWhitespaceTable7)[lVar9] != (char)pSVar4->flags_) {
          lVar9 = lVar9 + 1;
          pSVar21 = pSVar4;
          if (lVar9 == 6) goto LAB_0016fc3e;
        }
        pSVar21 = end;
      }
    }
  }
  goto LAB_0016fc3e;
  while( true ) {
    iVar16 = iVar16 + -1;
    pSVar20 = (StringToDoubleConverter *)((long)&pSVar4->flags_ + 1);
    local_370 = pSVar4;
    if ((char)pSVar4->flags_ != '0') break;
LAB_00170078:
    pSVar4 = pSVar20;
    if (pSVar4 == end) goto LAB_0016fd80;
  }
LAB_0017009c:
  do {
    dVar1 = *(double_conversion *)&pSVar4->flags_;
    uVar6 = (undefined7)(uVar5 >> 8);
    uVar5 = CONCAT71(uVar6,dVar1);
    if (9 < (byte)((char)dVar1 - 0x30U)) goto LAB_0016fe56;
    if (iVar19 < 0x304) {
      iVar14 = (int)pcVar15;
      if (0x30d < iVar14) {
        __assert_fail("buffer_pos < kBufferSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x349,
                      "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                     );
      }
      pcVar15 = (char *)(ulong)(iVar14 + 1);
      local_348[iVar14] = dVar1;
      iVar19 = iVar19 + 1;
      iVar16 = iVar16 + -1;
    }
    else {
      uVar5 = CONCAT71(uVar6,dVar1 != (double_conversion)0x30 | (byte)uVar7);
      uVar7 = uVar5;
    }
    pSVar4 = (StringToDoubleConverter *)((long)&pSVar4->flags_ + 1);
    pSVar21 = end;
  } while (pSVar4 != end);
LAB_0016fc3e:
  if ((uVar12 & 1) != 0) {
    local_350 = local_348;
    dVar26 = RadixStringToIeee<3,char*>
                       ((char **)&local_350,(char *)(local_348 + (int)pcVar15),sign,
                        SUB41((uVar2 & 4) >> 2,0),this->junk_string_value_,read_as_double,&local_351
                       );
    if (local_351 != true) {
      *processed_characters_count = (int)pSVar21 - iVar24;
      return dVar26;
    }
    __assert_fail("!result_is_junk",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x3a9,
                  "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                 );
  }
  uVar10 = (ulong)(uint)(iVar16 + (int)uVar10);
  uVar8 = uVar7;
  end = pSVar21;
LAB_0016fe04:
  if ((uVar8 & 1) != 0) {
    iVar19 = (int)pcVar15;
    pcVar15 = (char *)(ulong)(iVar19 + 1);
    local_348[iVar19] = (double_conversion)0x31;
    uVar10 = (ulong)((int)uVar10 - 1);
  }
  iVar19 = (int)pcVar15;
  if (0x30d < iVar19) {
    __assert_fail("buffer_pos < kBufferSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x3b3,
                  "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                 );
  }
  local_348[iVar19] = (double_conversion)0x0;
  if (read_as_double) {
    if (iVar19 < 0) {
LAB_0017029e:
      __assert_fail("len == 0 || (len > 0 && data != __null)",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                    ,0xb5,
                    "FIX::double_conversion::Vector<const char>::Vector(T *, int) [T = const char]")
      ;
    }
    buffer_00._8_8_ = uVar10;
    buffer_00.start_ = pcVar15;
    dVar26 = Strtod(local_348,buffer_00,(int)uVar8);
  }
  else {
    if (iVar19 < 0) goto LAB_0017029e;
    buffer_01._8_8_ = uVar10;
    buffer_01.start_ = pcVar15;
    fVar25 = Strtof(local_348,buffer_01,(int)uVar8);
    dVar26 = (double)fVar25;
  }
  *processed_characters_count = (int)end - iVar24;
  if (sign == false) {
    return dVar26;
  }
  return -dVar26;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  char buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != NULL) {
    if (*current == infinity_symbol_[0]) {
      if (!ConsumeSubString(&current, end, infinity_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != NULL) {
    if (*current == nan_symbol_[0]) {
      if (!ConsumeSubString(&current, end, nan_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    ++current;
    if (current == end) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if ((flags_ & ALLOW_HEX) && (*current == 'x' || *current == 'X')) {
      ++current;
      if (current == end || !isDigit(*current, 16)) {
        return junk_string_value_;  // "0x".
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      ++current;
      if (current == end) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    ++current;
    if (current == end) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    ++current;
    if (current == end) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        ++current;
        if (current == end) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      ++current;
      if (current == end) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  double converted;
  if (read_as_double) {
    converted = Strtod(Vector<const char>(buffer, buffer_pos), exponent);
  } else {
    converted = Strtof(Vector<const char>(buffer, buffer_pos), exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}